

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

size_t n_occurences(int *array,size_t length,int needle)

{
  size_t sVar1;
  size_t i;
  size_t sVar2;
  
  sVar1 = 0;
  for (sVar2 = 0; length != sVar2; sVar2 = sVar2 + 1) {
    sVar1 = sVar1 + (array[sVar2] == needle);
  }
  return sVar1;
}

Assistant:

size_t n_occurences(const int* array, const size_t length, const int needle) {
  size_t sum = 0;
  for (size_t i = 0; i < length; i++) {
    if (array[i] == needle) {
      sum++;
    }
  }
  return sum;
}